

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

InfoStatus
getLocalInfoValue(HighsLogOptions *report_log_options,string *name,bool valid,
                 vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,HighsInt *value)

{
  HighsInfoType type;
  InfoRecordInt *pIVar1;
  pointer pcVar2;
  InfoStatus IVar3;
  InfoStatus IVar4;
  HighsInt index;
  string local_b0;
  InfoRecordInt info;
  
  IVar3 = getInfoIndex(report_log_options,name,info_records,&index);
  IVar4 = kUnavailable;
  if (IVar3 != kOk) {
    IVar4 = IVar3;
  }
  if (IVar3 == kOk && valid) {
    pIVar1 = (InfoRecordInt *)
             (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl
             .super__Vector_impl_data._M_start[index];
    type = (pIVar1->super_InfoRecord).type;
    if (type == kInt) {
      InfoRecordInt::InfoRecordInt(&info,pIVar1);
      *value = *info.value;
      InfoRecord::~InfoRecord(&info.super_InfoRecord);
      IVar4 = kOk;
    }
    else {
      std::__cxx11::string::string((string *)&info,"HighsInt",(allocator *)&local_b0);
      pcVar2 = (name->_M_dataplus)._M_p;
      infoEntryTypeToString_abi_cxx11_(&local_b0,type);
      highsLogUser(report_log_options,kError,
                   "getInfoValue: Info \"%s\" requires value of type %s, not %s\n",pcVar2,
                   local_b0._M_dataplus._M_p,info.super_InfoRecord._vptr_InfoRecord);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&info);
      IVar4 = kIllegalValue;
    }
  }
  return IVar4;
}

Assistant:

InfoStatus getLocalInfoValue(const HighsLogOptions& report_log_options,
                             const std::string& name, const bool valid,
                             const std::vector<InfoRecord*>& info_records,
                             HighsInt& value) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  if (!valid) return InfoStatus::kUnavailable;
  HighsInfoType type = info_records[index]->type;
  bool type_ok = type == HighsInfoType::kInt;
  // When HIGHSINT64 is "on", value is int64_t and this method is used
  // get HighsInfo values of type HighsInfoType::kInt64
#ifdef HIGHSINT64
  type_ok = type_ok || type == HighsInfoType::kInt64;
#endif
  if (!type_ok) {
    std::string illegal_type = "HighsInt";
#ifdef HIGHSINT64
    illegal_type += " or int64_t";
#endif
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "getInfoValue: Info \"%s\" requires value of type %s, not %s\n",
        name.c_str(), infoEntryTypeToString(type).c_str(),
        illegal_type.c_str());
    return InfoStatus::kIllegalValue;
  }
  if (type == HighsInfoType::kInt) {
    InfoRecordInt info = ((InfoRecordInt*)info_records[index])[0];
    value = *info.value;
  } else {
    assert(type == HighsInfoType::kInt64);
    InfoRecordInt64 info = ((InfoRecordInt64*)info_records[index])[0];
    value = *info.value;
  }
  return InfoStatus::kOk;
}